

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::outmesh2medit(tetgenmesh *this,char *mfilename)

{
  memorypool *pmVar1;
  void **ppvVar2;
  size_t sVar3;
  FILE *__s;
  undefined8 *puVar4;
  tetrahedron *pppdVar5;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  tetgenbehavior *ptVar13;
  long lVar14;
  bool bVar15;
  char mefilename [1024];
  undefined8 local_438;
  
  if ((mfilename == (char *)0x0) || (*mfilename == '\0')) {
    ptVar13 = this->b;
    if (ptVar13->outfilename[0] == '\0') {
      local_438 = 0x64656d616e6e75;
    }
    else {
      strcpy((char *)&local_438,ptVar13->outfilename);
    }
  }
  else {
    strcpy((char *)&local_438,mfilename);
    ptVar13 = this->b;
  }
  sVar3 = strlen((char *)&local_438);
  *(undefined4 *)((long)&local_438 + sVar3) = 0x73656d2e;
  *(undefined2 *)((long)&local_438 + sVar3 + 4) = 0x68;
  if (ptVar13->quiet == 0) {
    printf("Writing %s.\n",&local_438);
  }
  __s = fopen((char *)&local_438,"w");
  if (__s == (FILE *)0x0) {
    printf("File I/O Error:  Cannot create file %s.\n",&local_438);
  }
  else {
    fwrite("MeshVersionFormatted 1\n",0x17,1,__s);
    fputc(10,__s);
    fwrite("Dimension\n",10,1,__s);
    fwrite("3\n",2,1,__s);
    fputc(10,__s);
    fwrite("\n# Set of mesh vertices\n",0x18,1,__s);
    fwrite("Vertices\n",9,1,__s);
    fprintf(__s,"%ld\n",this->points->items);
    pmVar1 = this->points;
    ppvVar2 = pmVar1->firstblock;
    pmVar1->pathblock = ppvVar2;
    pmVar1->pathitem =
         (void *)((long)ppvVar2 +
                 (((long)pmVar1->alignbytes + 8U) -
                 (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
    pmVar1->pathitemsleft = pmVar1->itemsperblock;
    while (puVar4 = (undefined8 *)memorypool::traverse(this->points), puVar4 != (undefined8 *)0x0) {
      if ((*(uint *)((long)puVar4 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) != 0xa00) {
        iVar12 = 1;
        do {
          fprintf(__s,"%.17g  %.17g  %.17g",*puVar4,puVar4[1],puVar4[2]);
          if (this->in->numberofpointattributes < 1) {
            fwrite("    0\n",6,1,__s);
          }
          else {
            fprintf(__s,"  %.17g\n",puVar4[3]);
          }
          *(int *)((long)puVar4 + (long)this->pointmarkindex * 4) = iVar12;
          do {
            puVar4 = (undefined8 *)memorypool::traverse(this->points);
            if (puVar4 == (undefined8 *)0x0) goto LAB_0015141d;
          } while ((*(uint *)((long)puVar4 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) ==
                   0xa00);
          iVar12 = iVar12 + 1;
        } while( true );
      }
    }
LAB_0015141d:
    lVar14 = this->hullsize;
    lVar9 = this->tetrahedrons->items - lVar14;
    fwrite("\n# Set of Triangles\n",0x14,1,__s);
    fwrite("Triangles\n",10,1,__s);
    fprintf(__s,"%ld\n",(lVar14 + lVar9 * 4) / 2);
    pmVar1 = this->tetrahedrons;
    ppvVar2 = pmVar1->firstblock;
    pmVar1->pathblock = ppvVar2;
    pmVar1->pathitem =
         (void *)((long)ppvVar2 +
                 (((long)pmVar1->alignbytes + 8U) -
                 (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
    pmVar1->pathitemsleft = pmVar1->itemsperblock;
    pppdVar5 = tetrahedrontraverse(this);
    while (pppdVar5 != (tetrahedron *)0x0) {
      lVar14 = 0;
      do {
        uVar6 = *(ulong *)((long)pppdVar5 + lVar14 * 2) & 0xfffffffffffffff0;
        if ((*(point *)(uVar6 + 0x38) == this->dummypoint) ||
           (*(int *)(pppdVar5 + 10) < *(int *)(uVar6 + 0x50))) {
          lVar11 = (long)this->pointmarkindex;
          uVar6 = 0;
          fprintf(__s,"%5d  %5d  %5d",
                  (ulong)*(uint *)((long)pppdVar5[*(int *)((long)orgpivot + lVar14)] + lVar11 * 4),
                  (ulong)*(uint *)((long)pppdVar5[*(int *)((long)destpivot + lVar14)] + lVar11 * 4),
                  (ulong)*(uint *)((long)pppdVar5[*(int *)((long)apexpivot + lVar14)] + lVar11 * 4))
          ;
          if ((pppdVar5[9] != (tetrahedron)0x0) &&
             (uVar7 = *(ulong *)((long)pppdVar5[9] + lVar14 * 2) & 0xfffffffffffffff8, uVar7 != 0))
          {
            uVar6 = (ulong)*(uint *)(uVar7 + (long)this->shmarkindex * 4);
          }
          fprintf(__s,"    %d\n",uVar6);
        }
        lVar14 = lVar14 + 4;
      } while (lVar14 != 0x10);
      pppdVar5 = tetrahedrontraverse(this);
    }
    fwrite("\n# Set of Tetrahedra\n",0x15,1,__s);
    fwrite("Tetrahedra\n",0xb,1,__s);
    fprintf(__s,"%ld\n",lVar9);
    pmVar1 = this->tetrahedrons;
    ppvVar2 = pmVar1->firstblock;
    pmVar1->pathblock = ppvVar2;
    pmVar1->pathitem =
         (void *)((long)ppvVar2 +
                 (((long)pmVar1->alignbytes + 8U) -
                 (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
    pmVar1->pathitemsleft = pmVar1->itemsperblock;
    pppdVar5 = tetrahedrontraverse(this);
    while (pppdVar5 != (tetrahedron *)0x0) {
      bVar15 = this->b->reversetetori == 0;
      lVar14 = (long)this->pointmarkindex;
      fprintf(__s,"%5d  %5d  %5d  %5d",
              (ulong)*(uint *)((long)pppdVar5[(ulong)!bVar15 + 4] + lVar14 * 4),
              (ulong)*(uint *)((long)pppdVar5[(ulong)bVar15 + 4] + lVar14 * 4),
              (ulong)*(uint *)((long)pppdVar5[6] + lVar14 * 4),
              (ulong)*(uint *)((long)pppdVar5[7] + lVar14 * 4));
      if (this->numelemattrib < 1) {
        fwrite("  0",3,1,__s);
      }
      else {
        fprintf(__s,"  %.17g",pppdVar5[this->elemattribindex]);
      }
      fputc(10,__s);
      pppdVar5 = tetrahedrontraverse(this);
    }
    fwrite("\nCorners\n",9,1,__s);
    fprintf(__s,"%d\n",(ulong)(uint)this->in->numberofpoints);
    if (0 < this->in->numberofpoints) {
      uVar10 = 0;
      do {
        uVar10 = uVar10 + 1;
        fprintf(__s,"%4d\n",(ulong)uVar10);
      } while ((int)uVar10 < this->in->numberofpoints);
    }
    if ((this->b->plc != 0) || (this->b->refine != 0)) {
      fwrite("\nEdges\n",7,1,__s);
      fprintf(__s,"%ld\n",this->subsegs->items);
      pmVar1 = this->subsegs;
      ppvVar2 = pmVar1->firstblock;
      pmVar1->pathblock = ppvVar2;
      pmVar1->pathitem =
           (void *)((long)ppvVar2 +
                   (((long)pmVar1->alignbytes + 8U) -
                   (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
      pmVar1->pathitemsleft = pmVar1->itemsperblock;
      while (pvVar8 = memorypool::traverse(pmVar1), pvVar8 != (void *)0x0) {
        if (*(long *)((long)pvVar8 + 0x18) != 0) {
          do {
            fprintf(__s,"%5d  %5d",
                    (ulong)*(uint *)(*(long *)((long)pvVar8 + (long)sorgpivot[0] * 8) +
                                    (long)this->pointmarkindex * 4),
                    (ulong)*(uint *)(*(long *)((long)pvVar8 + (long)sdestpivot[0] * 8) +
                                    (long)this->pointmarkindex * 4));
            fprintf(__s,"    %d\n",(ulong)*(uint *)((long)pvVar8 + (long)this->shmarkindex * 4));
            pmVar1 = this->subsegs;
            do {
              pvVar8 = memorypool::traverse(pmVar1);
              if (pvVar8 == (void *)0x0) goto LAB_00151843;
            } while (*(long *)((long)pvVar8 + 0x18) == 0);
          } while( true );
        }
      }
    }
LAB_00151843:
    fwrite("\nEnd\n",5,1,__s);
    fclose(__s);
  }
  return;
}

Assistant:

void tetgenmesh::outmesh2medit(char* mfilename)
{
  FILE *outfile;
  char mefilename[FILENAMESIZE];
  tetrahedron* tetptr;
  triface tface, tsymface;
  face segloop, checkmark;
  point ptloop, p1, p2, p3, p4;
  long ntets, faces;
  int pointnumber;
  int marker;
  int i;

  if (mfilename != (char *) NULL && mfilename[0] != '\0') {
    strcpy(mefilename, mfilename);
  } else if (b->outfilename[0] != '\0') {
    strcpy(mefilename, b->outfilename);
  } else {
    strcpy(mefilename, "unnamed");
  }
  strcat(mefilename, ".mesh");

  if (!b->quiet) {
    printf("Writing %s.\n", mefilename);
  }
  outfile = fopen(mefilename, "w");
  if (outfile == (FILE *) NULL) {
    printf("File I/O Error:  Cannot create file %s.\n", mefilename);
    return;
  }

  fprintf(outfile, "MeshVersionFormatted 1\n");
  fprintf(outfile, "\n");
  fprintf(outfile, "Dimension\n");
  fprintf(outfile, "3\n");
  fprintf(outfile, "\n");

  fprintf(outfile, "\n# Set of mesh vertices\n");
  fprintf(outfile, "Vertices\n");
  fprintf(outfile, "%ld\n", points->items);

  points->traversalinit();
  ptloop = pointtraverse();
  pointnumber = 1;                        // Medit need start number form 1.
  while (ptloop != (point) NULL) {
    // Point coordinates.
    fprintf(outfile, "%.17g  %.17g  %.17g", ptloop[0], ptloop[1], ptloop[2]);
    if (in->numberofpointattributes > 0) {
      // Write an attribute, ignore others if more than one.
      fprintf(outfile, "  %.17g\n", ptloop[3]);
    } else {
      fprintf(outfile, "    0\n");
    }
    setpointmark(ptloop, pointnumber);
    ptloop = pointtraverse();
    pointnumber++;
  }

  // Compute the number of faces.
  ntets = tetrahedrons->items - hullsize;
  faces = (ntets * 4l + hullsize) / 2l;

  fprintf(outfile, "\n# Set of Triangles\n");
  fprintf(outfile, "Triangles\n");
  fprintf(outfile, "%ld\n", faces);

  tetrahedrons->traversalinit();
  tface.tet = tetrahedrontraverse();
  while (tface.tet != (tetrahedron *) NULL) {
    for (tface.ver = 0; tface.ver < 4; tface.ver ++) {
      fsym(tface, tsymface);
      if (ishulltet(tsymface) || 
          (elemindex(tface.tet) < elemindex(tsymface.tet))) {
        p1 = org (tface);
        p2 = dest(tface);
        p3 = apex(tface);
        fprintf(outfile, "%5d  %5d  %5d",
                pointmark(p1), pointmark(p2), pointmark(p3));
        // Check if it is a subface.
        tspivot(tface, checkmark);
        if (checkmark.sh == NULL) {
          marker = 0;  // It is an inner face. It's marker is 0.
        } else {
          marker = shellmark(checkmark);
        }
        fprintf(outfile, "    %d\n", marker);
      }
    }
    tface.tet = tetrahedrontraverse();
  }

  fprintf(outfile, "\n# Set of Tetrahedra\n");
  fprintf(outfile, "Tetrahedra\n");
  fprintf(outfile, "%ld\n", ntets);

  tetrahedrons->traversalinit();
  tetptr = tetrahedrontraverse();
  while (tetptr != (tetrahedron *) NULL) {
    if (!b->reversetetori) {
      p1 = (point) tetptr[4];
      p2 = (point) tetptr[5];
    } else {
      p1 = (point) tetptr[5];
      p2 = (point) tetptr[4];
    }
    p3 = (point) tetptr[6];
    p4 = (point) tetptr[7];
    fprintf(outfile, "%5d  %5d  %5d  %5d",
            pointmark(p1), pointmark(p2), pointmark(p3), pointmark(p4));
    if (numelemattrib > 0) {
      fprintf(outfile, "  %.17g", elemattribute(tetptr, 0));
    } else {
      fprintf(outfile, "  0");
    }
    fprintf(outfile, "\n");
    tetptr = tetrahedrontraverse();
  }

  fprintf(outfile, "\nCorners\n");
  fprintf(outfile, "%d\n", in->numberofpoints);

  for (i = 0; i < in->numberofpoints; i++) {
    fprintf(outfile, "%4d\n", i + 1);
  }

  if (b->plc || b->refine) {
    fprintf(outfile, "\nEdges\n");
    fprintf(outfile, "%ld\n", subsegs->items);

    subsegs->traversalinit();
    segloop.sh = shellfacetraverse(subsegs);
    while (segloop.sh != (shellface *) NULL) {
      p1 = sorg(segloop);
      p2 = sdest(segloop);
      fprintf(outfile, "%5d  %5d", pointmark(p1), pointmark(p2));
      marker = shellmark(segloop);
      fprintf(outfile, "    %d\n", marker);
      segloop.sh = shellfacetraverse(subsegs);
    }
  }

  fprintf(outfile, "\nEnd\n");
  fclose(outfile);
}